

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int file_write(sptr_t data,char *path,char *mode)

{
  FILE *__s;
  size_t sVar1;
  uint uVar2;
  ulong __n;
  
  __n = data.size;
  uVar2 = 0;
  if (mode != (char *)0x0 && (path != (char *)0x0 && data.ptr != (uchar *)0x0)) {
    __s = fopen(path,mode);
    if (__s == (FILE *)0x0) {
      perror("Unable to open file for writing\n");
      uVar2 = 0;
      fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
    }
    else {
      sVar1 = fwrite(data.ptr,1,__n,__s);
      if (sVar1 < __n) {
        file_write_cold_1();
      }
      uVar2 = (uint)(sVar1 >= __n);
      fclose(__s);
    }
  }
  return uVar2;
}

Assistant:

int file_write(sptr_t data, const char *path, const char *mode)
{
	int result = 0;
	if (SPTR_IS_NULL(data) || path == NULL || mode == NULL) {
		return result;
	}
	FILE *f = fopen(path, mode);
	if (!f) {
		perror("Unable to open file for writing\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		return result;
	}
	size_t bytes = fwrite(data.ptr, 1, data.size, f);
	if (bytes < data.size) {
		fprintf(stderr, "Unable to write all bytes to a file\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		goto end;
	}
	result = 1;
end:
	fclose(f);
	return result;
}